

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int handle_handshake_done_frame(quicly_conn_t *conn,st_quicly_handle_payload_state_t *state)

{
  int iVar1;
  quicly_conn_t *in_RSI;
  quicly_conn_t *in_RDI;
  int ret;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int local_4;
  
  iVar1 = quicly_is_client(in_RDI);
  if (iVar1 == 0) {
    local_4 = 0x2000a;
  }
  else {
    if (in_RDI->initial != (st_quicly_handshake_space_t *)0x0) {
      __assert_fail("conn->initial == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                    ,0x14c5,
                    "int handle_handshake_done_frame(quicly_conn_t *, struct st_quicly_handle_payload_state_t *)"
                   );
    }
    if (in_RDI->handshake == (st_quicly_handshake_space_t *)0x0) {
      local_4 = 0;
    }
    else {
      *(byte *)&(in_RDI->super).remote.address_validation =
           *(byte *)&(in_RDI->super).remote.address_validation & 0xfd;
      local_4 = discard_handshake_context
                          (in_RSI,CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      if (local_4 == 0) {
        update_loss_alarm((quicly_conn_t *)state,ret);
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

static int handle_handshake_done_frame(quicly_conn_t *conn, struct st_quicly_handle_payload_state_t *state)
{
    int ret;

    QUICLY_PROBE(HANDSHAKE_DONE_RECEIVE, conn, conn->stash.now);

    if (!quicly_is_client(conn))
        return QUICLY_TRANSPORT_ERROR_PROTOCOL_VIOLATION;

    assert(conn->initial == NULL);
    if (conn->handshake == NULL)
        return 0;

    conn->super.remote.address_validation.send_probe = 0;
    if ((ret = discard_handshake_context(conn, QUICLY_EPOCH_HANDSHAKE)) != 0)
        return ret;
    update_loss_alarm(conn, 0);
    return 0;
}